

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O3

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::classAverage
          (ConfusionMatrix<int,_1> *this,function<double_(int)> *metric)

{
  iterator iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_color *p_Var6;
  double dVar7;
  int class_;
  _Rb_tree_color local_64;
  double local_60;
  _Rb_tree_color *local_58;
  iterator iStack_50;
  int *local_48;
  double local_38;
  
  local_58 = (_Rb_tree_color *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  p_Var3 = (this->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->cm)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    local_60 = 0.0;
    local_38 = 0.0;
  }
  else {
    iVar4 = 0;
    do {
      local_64 = p_Var3[1]._M_color;
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (local_58,iStack_50._M_current,&local_64);
      if (_Var2._M_current == iStack_50._M_current) {
        if (_Var2._M_current == local_48) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,iStack_50,(int *)&local_64);
        }
        else {
          *iStack_50._M_current = local_64;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        iVar4 = iVar4 + 1;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      iVar1._M_current = iStack_50._M_current;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    if (local_58 == (_Rb_tree_color *)iStack_50._M_current) {
      local_60 = 0.0;
    }
    else {
      local_60 = 0.0;
      p_Var6 = local_58;
      do {
        local_64 = *p_Var6;
        if ((metric->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        dVar7 = (*metric->_M_invoker)((_Any_data *)metric,(int *)&local_64);
        local_60 = local_60 + dVar7;
        p_Var6 = p_Var6 + 1;
      } while (p_Var6 != (_Rb_tree_color *)iVar1._M_current);
    }
    local_38 = (double)iVar4;
    if (local_58 != (_Rb_tree_color *)0x0) {
      operator_delete(local_58);
    }
  }
  return local_60 / local_38;
}

Assistant:

double classAverage(std::function<double(C)> metric) {
        double sum = 0.0;
        int numClasses = 0;
        std::vector<C> uniq {};
        for (auto p : cm) { // find all uniq classes
            auto class_ = p.first.first;
            auto hasClass = std::find(uniq.begin(), uniq.end(), class_) != uniq.end();
            if (!hasClass) {
                uniq.push_back(class_);
                numClasses++;
            }
        }
        for (auto class_ : uniq) { // calculate the average
            double class_value = metric(class_);
            sum += class_value;
        }
        return sum / numClasses;
    }